

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Set_data64(int g_a,int ndim,int64_t *dims,int type)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  Integer _ga_dims [7];
  Integer aIStack_38 [7];
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < ndim) {
    uVar2 = (ulong)(uint)ndim;
  }
  iVar3 = ndim + -1;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    aIStack_38[iVar3] = dims[uVar1];
    iVar3 = iVar3 + -1;
  }
  pnga_set_data((long)g_a,(long)ndim,aIStack_38,(long)type);
  return;
}

Assistant:

void NGA_Set_data64(int g_a, int ndim, int64_t dims[], int type)
{
    Integer aa, nndim, ttype;
    Integer _ga_dims[MAXDIM];
    COPYC2F(dims,_ga_dims, ndim);
    aa = (Integer)g_a;
    nndim = (Integer)ndim;
    ttype = (Integer)type;
    wnga_set_data(aa, nndim, _ga_dims, ttype);
}